

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumDescriptor::CopyTo(EnumDescriptor *this,EnumDescriptorProto *proto)

{
  int iVar1;
  long lVar2;
  void **ppvVar3;
  string *psVar4;
  EnumValueDescriptorProto *proto_00;
  EnumOptions *pEVar5;
  EnumOptions *pEVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  
  proto->_has_bits_[0] = proto->_has_bits_[0] | 1;
  psVar4 = proto->name_;
  if (psVar4 == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar4 = (string *)operator_new(0x20);
    (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
    psVar4->_M_string_length = 0;
    (psVar4->field_2)._M_local_buf[0] = '\0';
    proto->name_ = psVar4;
  }
  std::__cxx11::string::_M_assign((string *)psVar4);
  if (0 < *(int *)(this + 0x2c)) {
    lVar9 = 0;
    lVar7 = 0;
    do {
      lVar2 = *(long *)(this + 0x30);
      iVar1 = (proto->value_).super_RepeatedPtrFieldBase.current_size_;
      iVar8 = (proto->value_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar1 < iVar8) {
        ppvVar3 = (proto->value_).super_RepeatedPtrFieldBase.elements_;
        (proto->value_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        proto_00 = (EnumValueDescriptorProto *)ppvVar3[iVar1];
      }
      else {
        if (iVar8 == (proto->value_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(proto->value_).super_RepeatedPtrFieldBase,iVar8 + 1);
          iVar8 = (proto->value_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (proto->value_).super_RepeatedPtrFieldBase.allocated_size_ = iVar8 + 1;
        proto_00 = internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>::New();
        ppvVar3 = (proto->value_).super_RepeatedPtrFieldBase.elements_;
        iVar1 = (proto->value_).super_RepeatedPtrFieldBase.current_size_;
        (proto->value_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        ppvVar3[iVar1] = proto_00;
      }
      EnumValueDescriptor::CopyTo((EnumValueDescriptor *)(lVar2 + lVar9),proto_00);
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 0x28;
    } while (lVar7 < *(int *)(this + 0x2c));
  }
  pEVar6 = *(EnumOptions **)(this + 0x20);
  pEVar5 = EnumOptions::default_instance();
  if (pEVar6 != pEVar5) {
    *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] | 4;
    pEVar6 = proto->options_;
    if (pEVar6 == (EnumOptions *)0x0) {
      pEVar6 = (EnumOptions *)operator_new(0x68);
      EnumOptions::EnumOptions(pEVar6);
      proto->options_ = pEVar6;
    }
    EnumOptions::CopyFrom(pEVar6,*(EnumOptions **)(this + 0x20));
    return;
  }
  return;
}

Assistant:

void EnumDescriptor::CopyTo(EnumDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < value_count(); i++) {
    value(i)->CopyTo(proto->add_value());
  }

  if (&options() != &EnumOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}